

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.hpp
# Opt level: O1

char getch(void)

{
  int iVar1;
  ssize_t sVar2;
  char buf;
  char local_49;
  termios local_48;
  
  local_49 = '\0';
  local_48.c_cc[0x1f] = '\0';
  local_48._49_3_ = 0;
  local_48.c_ispeed = 0;
  local_48.c_ospeed = 0;
  local_48.c_cc[0xf] = '\0';
  local_48.c_cc[0x10] = '\0';
  local_48.c_cc[0x11] = '\0';
  local_48.c_cc[0x12] = '\0';
  local_48.c_cc[0x13] = '\0';
  local_48.c_cc[0x14] = '\0';
  local_48.c_cc[0x15] = '\0';
  local_48.c_cc[0x16] = '\0';
  local_48.c_cc[0x17] = '\0';
  local_48.c_cc[0x18] = '\0';
  local_48.c_cc[0x19] = '\0';
  local_48.c_cc[0x1a] = '\0';
  local_48.c_cc[0x1b] = '\0';
  local_48.c_cc[0x1c] = '\0';
  local_48.c_cc[0x1d] = '\0';
  local_48.c_cc[0x1e] = '\0';
  local_48.c_line = '\0';
  local_48.c_cc[0] = '\0';
  local_48.c_cc[1] = '\0';
  local_48.c_cc[2] = '\0';
  local_48.c_cc[3] = '\0';
  local_48.c_cc[4] = '\0';
  local_48.c_cc[5] = '\0';
  local_48.c_cc[6] = '\0';
  local_48.c_cc[7] = '\0';
  local_48.c_cc[8] = '\0';
  local_48.c_cc[9] = '\0';
  local_48.c_cc[10] = '\0';
  local_48.c_cc[0xb] = '\0';
  local_48.c_cc[0xc] = '\0';
  local_48.c_cc[0xd] = '\0';
  local_48.c_cc[0xe] = '\0';
  local_48.c_iflag = 0;
  local_48.c_oflag = 0;
  local_48.c_cflag = 0;
  local_48.c_lflag = 0;
  fflush(_stdout);
  iVar1 = tcgetattr(0,&local_48);
  if (iVar1 < 0) {
    perror("tcsetattr()");
  }
  local_48._8_8_ = local_48._8_8_ & 0xfffffff5ffffffff;
  local_48.c_cc._5_2_ = 0x100;
  iVar1 = tcsetattr(0,0,&local_48);
  if (iVar1 < 0) {
    perror("tcsetattr ICANON");
  }
  sVar2 = read(0,&local_49,1);
  if (sVar2 < 0) {
    perror("read()");
  }
  local_48._8_8_ = local_48._8_8_ | 0xa00000000;
  iVar1 = tcsetattr(0,1,&local_48);
  if (iVar1 < 0) {
    perror("tcsetattr ~ICANON");
  }
  return local_49;
}

Assistant:

char getch() {
    char buf = 0;
    struct termios old = {0};
    fflush(stdout);
    if (tcgetattr(0, &old) < 0)
        perror("tcsetattr()");
    old.c_lflag &= ~ICANON; // local modes = Non Canonical mode
    old.c_lflag &= ~ECHO; // local modes = Disable echo.
    old.c_cc[VMIN] = 1; // control chars (MIN value) = 1
    old.c_cc[VTIME] = 0; // control chars (TIME value) = 0 (No time)
    if (tcsetattr(0, TCSANOW, &old) < 0)
        perror("tcsetattr ICANON");
    if (read(0, &buf, 1) < 0)
        perror("read()");
    old.c_lflag |= ICANON; // local modes = Canonical mode
    old.c_lflag |= ECHO; // local modes = Enable echo.
    if (tcsetattr(0, TCSADRAIN, &old) < 0)
        perror("tcsetattr ~ICANON");
    return buf;
}